

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int isSCnumber(expdesc *e,int *pi,int *isfloat)

{
  int iVar1;
  anon_union_8_6_45a55102_for_u in_RAX;
  lua_Integer i;
  anon_union_8_6_45a55102_for_u local_28;
  
  if (e->k == VKFLT) {
    local_28 = in_RAX;
    iVar1 = luaV_flttointeger((e->u).nval,&local_28.ival,F2Ieq);
    if (iVar1 == 0) {
      return 0;
    }
    *isfloat = 1;
  }
  else {
    if (e->k != VKINT) {
      return 0;
    }
    local_28 = e->u;
  }
  if (e->t != e->f) {
    return 0;
  }
  if (0xfffffffffffffeff < local_28.ival - 0x81U) {
    *pi = local_28.info + 0x7f;
    return 1;
  }
  return 0;
}

Assistant:

static int isSCnumber (expdesc *e, int *pi, int *isfloat) {
  lua_Integer i;
  if (e->k == VKINT)
    i = e->u.ival;
  else if (e->k == VKFLT && luaV_flttointeger(e->u.nval, &i, F2Ieq))
    *isfloat = 1;
  else
    return 0;  /* not a number */
  if (!hasjumps(e) && fitsC(i)) {
    *pi = int2sC(cast_int(i));
    return 1;
  }
  else
    return 0;
}